

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

void ecc_edwards_get_affine(EdwardsPoint *ep,mp_int **x,mp_int **y)

{
  EdwardsCurve *pEVar1;
  mp_int *pmVar2;
  
  pEVar1 = ep->ec;
  pmVar2 = monty_invert(pEVar1->mc,ep->Z);
  monty_mul_into(pEVar1->mc,ep->X,ep->X,pmVar2);
  monty_mul_into(pEVar1->mc,ep->Y,ep->Y,pmVar2);
  monty_mul_into(pEVar1->mc,ep->Z,ep->Z,pmVar2);
  mp_free(pmVar2);
  monty_mul_into(pEVar1->mc,ep->T,ep->X,ep->Y);
  if (x != (mp_int **)0x0) {
    pmVar2 = monty_export(pEVar1->mc,ep->X);
    *x = pmVar2;
  }
  if (y != (mp_int **)0x0) {
    pmVar2 = monty_export(pEVar1->mc,ep->Y);
    *y = pmVar2;
  }
  return;
}

Assistant:

void ecc_edwards_get_affine(EdwardsPoint *ep, mp_int **x, mp_int **y)
{
    EdwardsCurve *ec = ep->ec;

    ecc_edwards_normalise(ep);

    if (x)
        *x = monty_export(ec->mc, ep->X);
    if (y)
        *y = monty_export(ec->mc, ep->Y);
}